

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O0

void randomizeNotes(vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes)

{
  result_type rVar1;
  size_type sVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  result_type_conflict1 rVar6;
  int local_2764;
  undefined1 local_2760 [4];
  int i;
  vector<pairing,_std::allocator<pairing>_> neworder;
  undefined1 local_2740 [4];
  int count;
  uniform_real_distribution<double> dist;
  undefined1 local_2720 [8];
  mt19937 md;
  random_device rd;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes_local;
  
  std::random_device::random_device((random_device *)&md._M_p);
  rVar1 = std::random_device::operator()((random_device *)&md._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2720,(ulong)rVar1);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_2740,0.0,100.0);
  sVar2 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(notes);
  neworder.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)sVar2;
  std::vector<pairing,_std::allocator<pairing>_>::vector
            ((vector<pairing,_std::allocator<pairing>_> *)local_2760);
  sVar2 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(notes);
  std::vector<pairing,_std::allocator<pairing>_>::resize
            ((vector<pairing,_std::allocator<pairing>_> *)local_2760,sVar2);
  local_2764 = 0;
  while( true ) {
    sVar2 = std::vector<pairing,_std::allocator<pairing>_>::size
                      ((vector<pairing,_std::allocator<pairing>_> *)local_2760);
    if ((int)sVar2 <= local_2764) break;
    pvVar3 = std::vector<pairing,_std::allocator<pairing>_>::operator[]
                       ((vector<pairing,_std::allocator<pairing>_> *)local_2760,(long)local_2764);
    pvVar3->index = local_2764;
    rVar6 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_2740,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2720);
    pvVar3 = std::vector<pairing,_std::allocator<pairing>_>::operator[]
                       ((vector<pairing,_std::allocator<pairing>_> *)local_2760,(long)local_2764);
    pvVar3->value = rVar6;
    local_2764 = local_2764 + 1;
  }
  iVar4 = std::vector<pairing,_std::allocator<pairing>_>::begin
                    ((vector<pairing,_std::allocator<pairing>_> *)local_2760);
  iVar5 = std::vector<pairing,_std::allocator<pairing>_>::end
                    ((vector<pairing,_std::allocator<pairing>_> *)local_2760);
  std::
  sort<__gnu_cxx::__normal_iterator<pairing*,std::vector<pairing,std::allocator<pairing>>>,randomizeNotes(std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>&)::__0>
            (iVar4._M_current,iVar5._M_current);
  for (local_2764 = 0;
      local_2764 <
      neworder.super__Vector_base<pairing,_std::allocator<pairing>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._4_4_; local_2764 = local_2764 + 1) {
    pvVar3 = std::vector<pairing,_std::allocator<pairing>_>::operator[]
                       ((vector<pairing,_std::allocator<pairing>_> *)local_2760,(long)local_2764);
    swapNotes(notes,local_2764,pvVar3->index);
  }
  std::vector<pairing,_std::allocator<pairing>_>::~vector
            ((vector<pairing,_std::allocator<pairing>_> *)local_2760);
  std::random_device::~random_device((random_device *)&md._M_p);
  return;
}

Assistant:

void randomizeNotes(vector<MidiEvent*>& notes) {
   random_device rd;
   mt19937 md(rd());
   uniform_real_distribution<double> dist(0, 100);
   int count = (int)notes.size();
   vector<pairing> neworder;
   neworder.resize(notes.size());
   int i;
   for (i=0; i<(int)neworder.size(); i++) {
      neworder[i].index = i;
      neworder[i].value = dist(md);
   }
   sort(neworder.begin(), neworder.end(),
      [](const pairing& a, const pairing& b) {
         return a.value > b.value;
      });

   for (i=0; i<count; i++) {
      swapNotes(notes, i, neworder[i].index);
   }
}